

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O0

parser_error parse_world_south(parser *p)

{
  errr eVar1;
  char *pcVar2;
  locality local_3c;
  char *pcStack_38;
  wchar_t i;
  level *lev;
  level_map_conflict *map;
  char *pcStack_20;
  wchar_t depth;
  char *l_name;
  parser *p_local;
  
  l_name = (char *)p;
  pcStack_20 = parser_getsym(p,"locality");
  map._4_4_ = parser_getint((parser *)l_name,"depth");
  lev = (level *)parser_priv((parser *)l_name);
  pcStack_38 = lev->north + (long)(int)(lev->topography - TOP_PLAIN) * 0x50;
  eVar1 = grab_name("locality",pcStack_20,localities,0x27,(int *)&local_3c);
  if (eVar1 == 0) {
    if (map._4_4_ == L'\0') {
      pcVar2 = locality_name(local_3c);
      pcVar2 = format("%s Town",pcVar2);
      pcVar2 = string_make(pcVar2);
      *(char **)(pcStack_38 + 0x28) = pcVar2;
    }
    else {
      pcVar2 = locality_name(local_3c);
      pcVar2 = format("%s %d",pcVar2,(ulong)(uint)map._4_4_);
      pcVar2 = string_make(pcVar2);
      *(char **)(pcStack_38 + 0x28) = pcVar2;
    }
    p_local._4_4_ = PARSE_ERROR_NONE;
  }
  else {
    p_local._4_4_ = PARSE_ERROR_INVALID_LOCALITY;
  }
  return p_local._4_4_;
}

Assistant:

static enum parser_error parse_world_south(struct parser *p) {
	const char *l_name = parser_getsym(p, "locality");
	const int depth = parser_getint(p, "depth");
	struct level_map *map = parser_priv(p);
	struct level *lev = &map->levels[map->num_levels - 1];
	int i;

	if (grab_name("locality", l_name, localities, N_ELEMENTS(localities), &i))
		return PARSE_ERROR_INVALID_LOCALITY;
	if (depth)
		lev->south = string_make(format("%s %d", locality_name(i), depth));
	else
		lev->south = string_make(format("%s Town", locality_name(i)));

	return PARSE_ERROR_NONE;
}